

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

uint PacketProcessor::Number(uchar b1,uchar b2,uchar b3,uchar b4)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,b1) == 0xfe) {
    b1 = '\x01';
  }
  if ((int)CONCAT71(in_register_00000031,b2) == 0xfe) {
    b2 = '\x01';
  }
  if ((int)CONCAT71(in_register_00000011,b3) == 0xfe) {
    b3 = '\x01';
  }
  if ((int)CONCAT71(in_register_00000009,b4) == 0xfe) {
    b4 = '\x01';
  }
  uVar1 = (uint)(byte)(b1 - 1);
  if (b1 == '\0') {
    uVar1 = 0x7f;
  }
  uVar4 = (uint)(byte)(b2 - 1);
  if (b2 == '\0') {
    uVar4 = 0x7f;
  }
  uVar3 = (uint)(byte)(b3 - 1);
  if (b3 == '\0') {
    uVar3 = 0x7f;
  }
  uVar2 = (uint)(byte)(b4 - 1);
  if (b4 == '\0') {
    uVar2 = 0x7f;
  }
  return uVar1 + uVar4 * 0xfd + uVar3 * 0xfa09 + uVar2 * 0xf71ae5;
}

Assistant:

unsigned int PacketProcessor::Number(unsigned char b1, unsigned char b2, unsigned char b3, unsigned char b4)
{
	if (b1 == 254) b1 = 1;
	if (b2 == 254) b2 = 1;
	if (b3 == 254) b3 = 1;
	if (b4 == 254) b4 = 1;

	if (b1 == 0) b1 = 128;
	if (b2 == 0) b2 = 128;
	if (b3 == 0) b3 = 128;
	if (b4 == 0) b4 = 128;

	--b1;
	--b2;
	--b3;
	--b4;

	return (b4*PacketProcessor::MAX3 + b3*PacketProcessor::MAX2 + b2*PacketProcessor::MAX1 + b1);
}